

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

Matrix4x4 * __thiscall
CMU462::DynamicScene::SceneObject::getRotation(Matrix4x4 *__return_storage_ptr__,SceneObject *this)

{
  double dVar1;
  double dVar2;
  Matrix4x4 local_220;
  Matrix4x4 local_1a0;
  Matrix4x4 local_120;
  Matrix4x4 local_a0;
  
  dVar1 = (this->rotation).y;
  dVar2 = (this->rotation).z;
  Matrix4x4::rotation(&local_120,(this->rotation).x * 3.141592653589793 * 0.005555555555555556,X);
  Matrix4x4::rotation(&local_1a0,dVar1 * 3.141592653589793 * 0.005555555555555556,Y);
  Matrix4x4::operator*(&local_a0,&local_120,&local_1a0);
  Matrix4x4::rotation(&local_220,dVar2 * 3.141592653589793 * 0.005555555555555556,Z);
  Matrix4x4::operator*(__return_storage_ptr__,&local_a0,&local_220);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 SceneObject::getRotation() {
  Vector3D rot = rotation * M_PI / 180;
  return Matrix4x4::rotation(rot.x, Matrix4x4::Axis::X) *
         Matrix4x4::rotation(rot.y, Matrix4x4::Axis::Y) *
         Matrix4x4::rotation(rot.z, Matrix4x4::Axis::Z);
}